

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone.c
# Opt level: O2

int findPendingSignal(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pObj;
  char *pcVar1;
  int i;
  
  i = 0;
  while( true ) {
    if (pNtk->vPos->nSize <= i) {
      return -1;
    }
    pObj = Abc_NtkPo(pNtk,i);
    pcVar1 = Abc_ObjName(pObj);
    pcVar1 = strstr(pcVar1,"pendingSignal");
    if (pcVar1 != (char *)0x0) break;
    i = i + 1;
  }
  return i;
}

Assistant:

int findPendingSignal(Abc_Ntk_t *pNtk)
{
    int i, pendingSignalIndex = -1;
    Abc_Obj_t *pNode;

    Abc_NtkForEachPo( pNtk, pNode, i )
    {
        if( strstr( Abc_ObjName( pNode ), "pendingSignal" ) != NULL )
        {
            pendingSignalIndex = i;
            break;
        }
    }    
    
    return pendingSignalIndex;
}